

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O1

void __thiscall
fizplex::BaseTestRegularWithReordering_ForwardTransformDVector_Test::TestBody
          (BaseTestRegularWithReordering_ForwardTransformDVector_Test *this)

{
  Base *this_00;
  DVector *vec;
  DVector *vec_00;
  bool bVar1;
  DVector *vec_01;
  char *pcVar2;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  AssertionResult gtest_ar;
  DVector local_60;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = &(this->super_BaseTestRegularWithReordering).b;
  vec = &(this->super_BaseTestRegularWithReordering).dv0;
  Base::ftran(this_00,vec);
  vec_00 = &(this->super_BaseTestRegularWithReordering).dv1;
  Base::ftran(this_00,vec_00);
  vec_01 = &(this->super_BaseTestRegularWithReordering).dv2;
  Base::ftran(this_00,vec_01);
  local_38.data_ = (AssertHelperData *)0xbf9cd85689039b0b;
  uStack_30 = 0x3fcea5dbf193d4bb;
  local_28 = 0x3fe0ad12073615a2;
  l._M_len = 3;
  l._M_array = (iterator)&local_38;
  DVector::DVector(&local_60,l);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            (local_48,"DVector({-2.0 / 71, 17.0 / 71, 37.0 / 71})","dv0",&local_60,vec);
  operator_delete(local_60.vals._M_data);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_60.vals._M_size != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60.vals._M_size != (long *)0x0)) {
        (**(code **)(*(long *)local_60.vals._M_size + 8))();
      }
      local_60.vals._M_size = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.data_ = (AssertHelperData *)0x3fbcd85689039b0b;
  uStack_30 = 0x3fa5a240e6c2b448;
  local_28 = 0xbfb5a240e6c2b448;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&local_38;
  DVector::DVector(&local_60,l_00);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            (local_48,"DVector({8.0 / 71, 3.0 / 71, -6.0 / 71})","dv1",&local_60,vec_00);
  operator_delete(local_60.vals._M_data);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_60.vals._M_size != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60.vals._M_size != (long *)0x0)) {
        (**(code **)(*(long *)local_60.vals._M_size + 8))();
      }
      local_60.vals._M_size = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38.data_ = (AssertHelperData *)0xbfb2073615a240e7;
  uStack_30 = 0x3fb93d4bb7e327a9;
  local_28 = 0xbfc93d4bb7e327a9;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&local_38;
  DVector::DVector(&local_60,l_01);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            (local_48,"DVector({-5.0 / 71, 7.0 / 71, -14.0 / 71})","dv2",&local_60,vec_01);
  operator_delete(local_60.vals._M_data);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_60.vals._M_size != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_60.vals._M_size != (long *)0x0)) {
        (**(code **)(*(long *)local_60.vals._M_size + 8))();
      }
      local_60.vals._M_size = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, ForwardTransformDVector) {
  b.ftran(dv0);
  b.ftran(dv1);
  b.ftran(dv2);
  EXPECT_EQ(DVector({-2.0 / 71, 17.0 / 71, 37.0 / 71}), dv0);
  EXPECT_EQ(DVector({8.0 / 71, 3.0 / 71, -6.0 / 71}), dv1);
  EXPECT_EQ(DVector({-5.0 / 71, 7.0 / 71, -14.0 / 71}), dv2);
}